

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall
CRegexSearcher::match_pattern
          (CRegexSearcher *this,re_compiled_pattern *pattern,char *entirestr,char *searchstr,
          size_t searchlen,re_group_register *regs)

{
  int iVar1;
  short loop_vars [20];
  re_compiled_pattern_base *in_stack_00000148;
  size_t in_stack_00000150;
  char *in_stack_00000158;
  size_t in_stack_00000160;
  char *in_stack_00000168;
  CRegexSearcher *in_stack_00000170;
  re_tuple *in_stack_00000190;
  re_machine *in_stack_00000198;
  re_group_register *in_stack_000001a0;
  short *in_stack_000001a8;
  
  iVar1 = match(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                in_stack_00000150,in_stack_00000148,in_stack_00000190,in_stack_00000198,
                in_stack_000001a0,in_stack_000001a8);
  return iVar1;
}

Assistant:

int CRegexSearcher::match_pattern(
    const re_compiled_pattern *pattern,
    const char *entirestr, const char *searchstr, size_t searchlen, 
    re_group_register *regs)
{
    short loop_vars[RE_LOOP_VARS_MAX];

    /* match the string */
    return match(entirestr, searchlen + (searchstr - entirestr),
                 searchstr, searchlen,
                 pattern, pattern->tuples, &pattern->machine,
                 regs, loop_vars);
}